

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_3ebaea::getInputPath(string *arg,cmExecutionStatus *status,string *path)

{
  cmValue cVar1;
  long *local_40 [2];
  long local_30 [2];
  
  cVar1 = cmMakefile::GetDefinition(status->Makefile,arg);
  if (cVar1.Value == (string *)0x0) {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"undefined variable for input path.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)path);
  }
  return cVar1.Value != (string *)0x0;
}

Assistant:

bool getInputPath(const std::string& arg, cmExecutionStatus& status,
                  std::string& path)
{
  cmValue def = status.GetMakefile().GetDefinition(arg);
  if (!def) {
    status.SetError("undefined variable for input path.");
    return false;
  }

  path = *def;
  return true;
}